

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O1

collision_object_ptr __thiscall
APhyBullet::BulletEngine::createSimpleRigidBody
          (BulletEngine *this,aphy_scalar mass,motion_state_ref *motion_state,
          collision_shape_ref *collision_shape,aphy_vector3 param_4)

{
  btRigidBody *this_00;
  BulletCollisionObject *this_01;
  collision_object_ptr prVar1;
  btVector3 local_30;
  
  local_30.m_floats._0_8_ = param_4._0_8_;
  prVar1 = (collision_object_ptr)0x0;
  if ((motion_state->counter != (Counter *)0x0) && (collision_shape->counter != (Counter *)0x0)) {
    local_30.m_floats[2] = param_4.z;
    local_30.m_floats[3] = 0.0;
    this_00 = (btRigidBody *)btAlignedAllocInternal(0x2c0,0x10);
    btRigidBody::btRigidBody
              (this_00,mass,
               (btMotionState *)
               motion_state->counter->object[1].super_base_interface._vptr_base_interface,
               (btCollisionShape *)
               collision_shape->counter->object[1].super_base_interface._vptr_base_interface,
               &local_30);
    this_01 = (BulletCollisionObject *)operator_new(0x30);
    BulletCollisionObject::BulletCollisionObject(this_01,(btCollisionObject *)this_00,RigidBody);
    prVar1 = (collision_object_ptr)operator_new(0x18);
    prVar1->dispatchTable = (aphy_icd_dispatch *)aphy::cppRefcountedDispatchTable;
    prVar1->object = (collision_object *)this_01;
    prVar1->strongCount = (__atomic_base<unsigned_int>)0x1;
    prVar1->weakCount = (__atomic_base<unsigned_int>)0x0;
    (this_01->super_collision_object).super_base_interface.myRefCounter = prVar1;
    aphy::ref<aphy::motion_state>::operator=(&this_01->motionState,motion_state);
    aphy::ref<aphy::collision_shape>::operator=(&this_01->collisionShape,collision_shape);
  }
  return prVar1;
}

Assistant:

collision_object_ptr BulletEngine::createSimpleRigidBody(aphy_scalar mass, const motion_state_ref &motion_state, const collision_shape_ref &collision_shape, aphy_vector3 local_inertia)
{
    if(!motion_state || !collision_shape)
        return nullptr;

    auto inertia = btVector3(local_inertia.x, local_inertia.y, local_inertia.z);
    auto result = makeObject<BulletCollisionObject> (
        new btRigidBody(mass,
            motion_state.as<BulletMotionState> ()->handle,
            collision_shape.as<BulletCollisionShape> ()->handle,
            inertia),
        APhyCollisionObjectType::RigidBody);

    auto collisionObject = result.as<BulletCollisionObject> ();
    collisionObject->motionState = motion_state;
    collisionObject->collisionShape = collision_shape;
    return result.disown();
}